

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SO3.h
# Opt level: O3

string * __thiscall
mnf::SO3<mnf::ExpMapMatrix>::toString
          (string *__return_storage_ptr__,SO3<mnf::ExpMapMatrix> *this,ConstRefVec *val,
          string *prefix,IOFormat *fmt)

{
  pointer pcVar1;
  PointerType ptr;
  ostream *s;
  string matPrefix;
  stringstream ss;
  char *local_320;
  ulong local_318;
  char local_310 [16];
  PointerType local_300;
  IOFormat local_2f0;
  stringstream local_200 [16];
  ostream local_1f0 [112];
  ios_base local_180 [264];
  Matrix<double,_3,_3,_0,_3,_3> local_78;
  
  pcVar1 = (prefix->_M_dataplus)._M_p;
  local_320 = local_310;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_320,pcVar1,pcVar1 + prefix->_M_string_length);
  std::__cxx11::string::_M_replace_aux((ulong)&local_320,local_318,0,'\x01');
  std::__cxx11::stringstream::stringstream(local_200);
  s = std::__ostream_insert<char,std::char_traits<char>>(local_1f0,local_320,local_318);
  local_300 = (val->
              super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
              ).
              super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,_0>
              .m_data;
  Eigen::IOFormat::IOFormat(&local_2f0,fmt);
  local_78.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[0] =
       *local_300;
  local_78.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[1] =
       local_300[1];
  local_78.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[2] =
       local_300[2];
  local_78.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[3] =
       local_300[3];
  local_78.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[4] =
       local_300[4];
  local_78.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[5] =
       local_300[5];
  local_78.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[6] =
       local_300[6];
  local_78.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[7] =
       local_300[7];
  local_78.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[8] =
       local_300[8];
  Eigen::internal::print_matrix<Eigen::Matrix<double,3,3,0,3,3>>(s,&local_78,&local_2f0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f0.coeffSeparator._M_dataplus._M_p != &local_2f0.coeffSeparator.field_2) {
    operator_delete(local_2f0.coeffSeparator._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f0.rowSpacer._M_dataplus._M_p != &local_2f0.rowSpacer.field_2) {
    operator_delete(local_2f0.rowSpacer._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f0.rowSeparator._M_dataplus._M_p != &local_2f0.rowSeparator.field_2) {
    operator_delete(local_2f0.rowSeparator._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f0.rowSuffix._M_dataplus._M_p != &local_2f0.rowSuffix.field_2) {
    operator_delete(local_2f0.rowSuffix._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f0.rowPrefix._M_dataplus._M_p != &local_2f0.rowPrefix.field_2) {
    operator_delete(local_2f0.rowPrefix._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f0.matSuffix._M_dataplus._M_p != &local_2f0.matSuffix.field_2) {
    operator_delete(local_2f0.matSuffix._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f0.matPrefix._M_dataplus._M_p != &local_2f0.matPrefix.field_2) {
    operator_delete(local_2f0.matPrefix._M_dataplus._M_p);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_200);
  std::ios_base::~ios_base(local_180);
  if (local_320 != local_310) {
    operator_delete(local_320);
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::string SO3<Map>::toString(const ConstRefVec& val,
                                      const std::string& prefix,
                                      const Eigen::IOFormat& fmt) const
{
  std::string matPrefix = prefix + '[';
  std::stringstream ss;
  ss << matPrefix
     << (Eigen::Map<const typename Map::DisplayType>(val.data())).format(fmt);
  return ss.str();
}